

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFAcroFormDocumentHelper.cc
# Opt level: O2

void __thiscall
QPDFAcroFormDocumentHelper::addFormField
          (QPDFAcroFormDocumentHelper *this,QPDFFormFieldObjectHelper *ff)

{
  _Rb_tree_header *this_00;
  bool bVar1;
  BaseHandle *pBVar2;
  QPDFObjectHandle fields;
  QPDFObjectHandle acroform;
  set visited;
  allocator<char> local_a9;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_a8;
  undefined1 local_98 [16];
  _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
  local_88;
  QPDFObjectHandle local_58;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  getOrCreateAcroForm((QPDFAcroFormDocumentHelper *)local_98);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"/Fields",(allocator<char> *)&local_28);
  QPDFObjectHandle::getKey((QPDFObjectHandle *)&local_a8,(string *)local_98);
  std::__cxx11::string::~string((string *)&local_88);
  bVar1 = QPDFObjectHandle::isArray((QPDFObjectHandle *)&local_a8);
  if (!bVar1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"/Fields",&local_a9);
    QPDFObjectHandle::newArray();
    QPDFObjectHandle::replaceKeyAndGetNew
              ((QPDFObjectHandle *)&local_28,(string *)local_98,(QPDFObjectHandle *)&local_88);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=(&local_a8,&local_28);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
    std::__cxx11::string::~string((string *)&local_88);
  }
  pBVar2 = &(ff->super_QPDFObjectHelper).super_BaseHandle;
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_88,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)pBVar2);
  QPDFObjectHandle::appendItem((QPDFObjectHandle *)&local_a8,(QPDFObjectHandle *)&local_88);
  this_00 = &local_88._M_impl.super__Rb_tree_header;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)this_00);
  local_88._M_impl.super__Rb_tree_header._M_header._M_color = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_left = &this_00->_M_header;
  local_88._M_impl.super__Rb_tree_header._M_header._M_right = &this_00->_M_header;
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_48,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)pBVar2);
  QPDFObjectHandle::newNull();
  traverseField(this,(QPDFObjectHandle *)&local_48,&local_58,0,(set *)&local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_58.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  std::
  _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
  ::~_Rb_tree(&local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98 + 8));
  return;
}

Assistant:

void
QPDFAcroFormDocumentHelper::addFormField(QPDFFormFieldObjectHelper ff)
{
    auto acroform = getOrCreateAcroForm();
    auto fields = acroform.getKey("/Fields");
    if (!fields.isArray()) {
        fields = acroform.replaceKeyAndGetNew("/Fields", QPDFObjectHandle::newArray());
    }
    fields.appendItem(ff.getObjectHandle());
    QPDFObjGen::set visited;
    traverseField(ff.getObjectHandle(), QPDFObjectHandle::newNull(), 0, visited);
}